

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalAccessChainConvertPass::AppendConstantOperands
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *in_opnds)

{
  anon_class_24_3_37cfb37c local_60;
  function<void_(const_unsigned_int_*)> local_48;
  uint32_t local_24;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *pvStack_20;
  uint32_t iidIdx;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *in_opnds_local;
  Instruction *ptrInst_local;
  LocalAccessChainConvertPass *this_local;
  
  local_24 = 0;
  local_60.iidIdx = &local_24;
  local_60.in_opnds = &stack0xffffffffffffffe0;
  local_60.this = this;
  pvStack_20 = in_opnds;
  in_opnds_local =
       (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)ptrInst;
  ptrInst_local = (Instruction *)this;
  std::function<void(unsigned_int_const*)>::
  function<spvtools::opt::LocalAccessChainConvertPass::AppendConstantOperands(spvtools::opt::Instruction_const*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>*)::__0,void>
            ((function<void(unsigned_int_const*)> *)&local_48,&local_60);
  Instruction::ForEachInId(ptrInst,&local_48);
  std::function<void_(const_unsigned_int_*)>::~function(&local_48);
  return;
}

Assistant:

void LocalAccessChainConvertPass::AppendConstantOperands(
    const Instruction* ptrInst, std::vector<Operand>* in_opnds) {
  uint32_t iidIdx = 0;
  ptrInst->ForEachInId([&iidIdx, &in_opnds, this](const uint32_t* iid) {
    if (iidIdx > 0) {
      const Instruction* cInst = get_def_use_mgr()->GetDef(*iid);
      const auto* constant_value =
          context()->get_constant_mgr()->GetConstantFromInst(cInst);
      assert(constant_value != nullptr &&
             "Expecting the index to be a constant.");

      // We take the sign extended value because OpAccessChain interprets the
      // index as signed.
      int64_t long_value = constant_value->GetSignExtendedValue();
      assert(long_value <= UINT32_MAX && long_value >= 0 &&
             "The index value is too large for a composite insert or extract "
             "instruction.");

      uint32_t val = static_cast<uint32_t>(long_value);
      in_opnds->push_back(
          {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {val}});
    }
    ++iidIdx;
  });
}